

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_misc_tests.cpp
# Opt level: O1

void __thiscall
iu_UnitAnyTest_x_iutest_x_Empty_Test::Body(iu_UnitAnyTest_x_iutest_x_Empty_Test *this)

{
  AssertionResult iutest_ar;
  int *in_stack_fffffffffffffde8;
  long *in_stack_fffffffffffffdf0;
  long local_200 [2];
  char local_1f0;
  AssertionHelper local_1e8;
  undefined1 local_1b8 [432];
  
  iutest::internal::NullHelper<false>::CompareEq<int>
            ((char *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  if (local_1f0 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,(char *)in_stack_fffffffffffffdf0,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_misc_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x2e;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if (in_stack_fffffffffffffdf0 != local_200) {
    operator_delete(in_stack_fffffffffffffdf0,local_200[0] + 1);
  }
  return;
}

Assistant:

IUTEST(UnitAnyTest, Empty)
{
    ::iutest::any a;
    ::iutest::any* p = NULL;
    IUTEST_EXPECT_NULL(::iutest::unsafe_any_cast<int>(p));
    IUTEST_EXPECT_NULL(::iutest::unsafe_any_cast<int>(&a));
}